

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

void textblock_resize_if_needed(textblock *tb,size_t additional_size)

{
  size_t sVar1;
  wchar_t *pwVar2;
  uint8_t *puVar3;
  
  sVar1 = tb->strlen;
  if (tb->size - sVar1 < additional_size) {
    tb->size = additional_size + 0x80 + sVar1;
    pwVar2 = (wchar_t *)mem_realloc(tb->text,(additional_size + sVar1) * 4 + 0x200);
    tb->text = pwVar2;
    puVar3 = (uint8_t *)mem_realloc(tb->attrs,tb->size);
    tb->attrs = puVar3;
  }
  return;
}

Assistant:

static void textblock_resize_if_needed(textblock *tb, size_t additional_size)
{
	size_t remaining = tb->size - tb->strlen;

	/* If we need more room, reallocate it */
	if (remaining < additional_size) {
		tb->size = TEXTBLOCK_LEN_INCR(tb->strlen + additional_size);
		tb->text = mem_realloc(tb->text, tb->size * sizeof *tb->text);
		tb->attrs = mem_realloc(tb->attrs, tb->size);
	}
}